

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void NodeRegisterClassEx(nodemodule *Module,nodemeta *Meta)

{
  nodecontext *p_00;
  fourcc_t *pfVar1;
  fourcc_t ClassId_00;
  nodeclass *pnVar2;
  nodeclass *Class_00;
  nodemodule **ppnVar3;
  nodemeta *i;
  size_t VMTSize;
  fourcc_t ClassId;
  fourcc_t ParentId;
  nodeclass *ParentClass;
  nodecontext *p;
  nodeclass *Class;
  nodemeta *Meta_local;
  nodemodule *Module_local;
  
  if (Module == (nodemodule *)0x0) {
    __assert_fail("(const void*)(Module)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x550,"void NodeRegisterClassEx(nodemodule *, const nodemeta *)");
  }
  p_00 = *(Module->Base).VMT;
  Class = (nodeclass *)Meta;
  do {
    if ((Class->FourCC & 0xff) != 1) {
      return;
    }
    ppnVar3 = &Class->Module;
    VMTSize._0_4_ = (fourcc_t)Class->Meta;
    i = (nodemeta *)0x48;
    Class = (nodeclass *)ppnVar3;
    if ((fourcc_t)VMTSize == 0) {
      VMTSize._0_4_ = p_00->DynamicClass + 1;
      p_00->DynamicClass = (fourcc_t)VMTSize;
    }
    for (; (Class->FourCC & 0xff) != 0; Class = (nodeclass *)&Class->Module) {
      if ((Class->FourCC & 0xff) == 0xf) {
        i = Class->Meta;
      }
    }
    ClassId_00 = (fourcc_t)Class->Meta;
    pnVar2 = NodeContext_FindClassEx(p_00,ClassId_00,Module);
    if ((i == (nodemeta *)0x48) && (pnVar2 != (nodeclass *)0x0)) {
      i = (nodemeta *)pnVar2->VMTSize;
    }
    Class_00 = NodeContext_CreateClass(p_00,(fourcc_t)VMTSize,(size_t)i,Module);
    if (Class_00 != (nodeclass *)0x0) {
      Class_00->Meta = (nodemeta *)ppnVar3;
      Class_00->ParentId = ClassId_00;
      Class_00->ParentClass = pnVar2;
      InitClass(p_00,Class_00);
    }
    pfVar1 = &Class->FourCC;
    Class = (nodeclass *)&Class->Module;
  } while (*pfVar1 >> 8 != 0);
  return;
}

Assistant:

void NodeRegisterClassEx(nodemodule* Module,const nodemeta* Meta)
{
    nodeclass* Class;
    nodecontext* p = Node_Context(Module);

    while (Meta->Meta == META_CLASS_CLASS_ID)
    {
        const nodeclass* ParentClass;
        fourcc_t ParentId;
        fourcc_t ClassId = (fourcc_t)(Meta++)->Data;
        size_t VMTSize = DEFAULT_VMT;
        const nodemeta* i = Meta;

        if (!ClassId)
            ClassId = ++p->DynamicClass;

        for (;Meta->Meta != META_CLASS_PARENT_ID;++Meta)
            if (Meta->Meta == META_CLASS_VMT_SIZE)
                VMTSize = (size_t)(Meta->Data);

        ParentId = (fourcc_t)Meta->Data;
        ParentClass = NodeContext_FindClassEx(p,ParentId,Module);

        if (VMTSize == DEFAULT_VMT && ParentClass)
            VMTSize = ParentClass->VMTSize;

        Class = NodeContext_CreateClass(p,ClassId,VMTSize,Module);
        if (Class)
        {
            Class->Meta = i;
            Class->ParentId = ParentId;
            Class->ParentClass = ParentClass;
            InitClass(p,Class);
        }

        if (!(Meta++)->Id) // more classes?
            break;
    }
}